

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkShapes.cpp
# Opt level: O1

void __thiscall
CoreML::NeuralNetworkShaper::shapePoolingLayer
          (NeuralNetworkShaper *this,NeuralNetworkLayer *specLayer)

{
  uint32 uVar1;
  int iVar2;
  int iVar3;
  LogMessage *pLVar4;
  mapped_type *this_00;
  mapped_type *this_01;
  ShapeRange *pSVar5;
  ShapeRange *pSVar6;
  LayerUnion LVar7;
  BorderAmounts *pBVar8;
  runtime_error *this_02;
  PoolingLayerParams_ValidCompletePadding *pPVar9;
  size_t sVar10;
  size_t sVar11;
  ValidPadding *pVVar12;
  long lVar13;
  int iVar14;
  LogMessage *__return_storage_ptr__;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  LogMessage local_2f8;
  LogMessage local_2c0;
  undefined1 local_288 [32];
  undefined1 local_268 [32];
  LogMessage local_248;
  LogMessage local_210;
  ShapeRange local_1d8;
  LogMessage local_1b8;
  LogMessage local_180;
  LogMessage local_148;
  LogMessage local_110;
  LogMessage local_d8;
  LogMessage local_a0;
  LogMessage local_68;
  
  if ((specLayer->input_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_1b8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar4 = google::protobuf::internal::LogMessage::operator<<
                       (&local_1b8,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_2f8,pLVar4);
    google::protobuf::internal::LogMessage::~LogMessage(&local_1b8);
  }
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
            ::operator[](&this->blobShapes,
                         (key_type *)
                         ((specLayer->input_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
  if ((specLayer->output_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_180,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar4 = google::protobuf::internal::LogMessage::operator<<
                       (&local_180,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_2f8,pLVar4);
    google::protobuf::internal::LogMessage::~LogMessage(&local_180);
  }
  this_01 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
            ::operator[](&this->blobShapes,
                         (key_type *)
                         ((specLayer->output_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
  if ((specLayer->output_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_148,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar4 = google::protobuf::internal::LogMessage::operator<<
                       (&local_148,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_2f8,pLVar4);
    google::protobuf::internal::LogMessage::~LogMessage(&local_148);
  }
  ShapeConstraint::setName
            (this_01,(string *)((specLayer->output_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
  pSVar5 = ShapeConstraint::sequenceRange(this_01);
  pSVar6 = ShapeConstraint::sequenceRange(this_00);
  ShapeRange::intersect((ShapeRange *)&local_2f8,pSVar5,pSVar6);
  ShapeConstraint::updateSequenceRange(this_01,(ShapeRange *)&local_2f8);
  pSVar5 = ShapeConstraint::batchRange(this_01);
  pSVar6 = ShapeConstraint::batchRange(this_00);
  ShapeRange::intersect((ShapeRange *)&local_2f8,pSVar5,pSVar6);
  ShapeConstraint::updateBatchRange(this_01,(ShapeRange *)&local_2f8);
  pSVar5 = ShapeConstraint::channelRange(this_00);
  ShapeConstraint::updateChannelRange(this_01,pSVar5);
  pSVar5 = ShapeConstraint::sequenceRange(this_01);
  ShapeConstraint::updateSequenceRange(this_00,pSVar5);
  pSVar5 = ShapeConstraint::batchRange(this_01);
  ShapeConstraint::updateBatchRange(this_00,pSVar5);
  pSVar5 = ShapeConstraint::channelRange(this_01);
  ShapeConstraint::updateChannelRange(this_00,pSVar5);
  if (specLayer->_oneof_case_[0] == 0x78) {
    LVar7 = specLayer->layer_;
  }
  else {
    LVar7.pooling_ = Specification::PoolingLayerParams::default_instance();
  }
  iVar16 = ((LVar7.convolution_)->kernelsize_).current_size_;
  if (iVar16 == 0) {
    iVar19 = 3;
    iVar16 = 3;
  }
  else {
    if (iVar16 < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_110,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x476);
      pLVar4 = google::protobuf::internal::LogMessage::operator<<
                         (&local_110,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_2f8,pLVar4);
      google::protobuf::internal::LogMessage::~LogMessage(&local_110);
    }
    iVar16 = *(int *)&((LVar7.innerproduct_)->bias_->_internal_metadata_).
                      super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
                      .ptr_;
    if (((LVar7.convolution_)->kernelsize_).current_size_ < 2) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_d8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x476);
      pLVar4 = google::protobuf::internal::LogMessage::operator<<
                         (&local_d8,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_2f8,pLVar4);
      google::protobuf::internal::LogMessage::~LogMessage(&local_d8);
    }
    iVar19 = ((LVar7.innerproduct_)->bias_->floatvalue_).current_size_;
  }
  iVar18 = ((LVar7.convolution_)->stride_).current_size_;
  if (iVar18 == 0) {
    iVar15 = 1;
    iVar18 = 1;
  }
  else {
    if (iVar18 < 1) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_a0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x476);
      pLVar4 = google::protobuf::internal::LogMessage::operator<<
                         (&local_a0,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_2f8,pLVar4);
      google::protobuf::internal::LogMessage::~LogMessage(&local_a0);
    }
    iVar18 = *(int *)&((LVar7.cropresize_)->boxindicesmode_->_internal_metadata_).
                      super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
                      .ptr_;
    if (((LVar7.convolution_)->stride_).current_size_ < 2) {
      google::protobuf::internal::LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x476);
      pLVar4 = google::protobuf::internal::LogMessage::operator<<
                         (&local_68,"CHECK failed: (index) < (current_size_): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_2f8,pLVar4);
      google::protobuf::internal::LogMessage::~LogMessage(&local_68);
    }
    iVar15 = (LVar7.cropresize_)->boxindicesmode_->boxmode_;
  }
  if ((LVar7.pooling_)->globalpooling_ == true) {
    ShapeConstraint::setHeight(this_01,1);
    ShapeConstraint::setWidth(this_01,1);
  }
  else {
    uVar1 = (LVar7.scale_)->_cached_size_;
    if ((int)uVar1 < 0x1f) {
      if (uVar1 != 0x1e) {
        if (uVar1 != 0) {
          return;
        }
        this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_02,"Pooling padding type not set");
        __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pBVar8 = ((PoolingPaddingTypeUnion *)&(LVar7.scale_)->bias_)->valid_->paddingamounts_;
      if (pBVar8 == (BorderAmounts *)0x0) {
        pBVar8 = (BorderAmounts *)&Specification::_BorderAmounts_default_instance_;
      }
      if ((pBVar8->borderamounts_).super_RepeatedPtrFieldBase.current_size_ == 0) {
        iVar3 = 0;
        iVar14 = 0;
        iVar17 = 0;
      }
      else {
        if ((LVar7.pooling_)->_oneof_case_[0] == 0x1e) {
          pVVar12 = ((PoolingPaddingTypeUnion *)&(LVar7.scale_)->bias_)->valid_;
        }
        else {
          pVVar12 = Specification::ValidPadding::default_instance();
        }
        pBVar8 = pVVar12->paddingamounts_;
        if (pBVar8 == (BorderAmounts *)0x0) {
          pBVar8 = (BorderAmounts *)&Specification::_BorderAmounts_default_instance_;
        }
        if ((pBVar8->borderamounts_).super_RepeatedPtrFieldBase.current_size_ < 1) {
          google::protobuf::internal::LogMessage::LogMessage
                    (&local_210,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                     ,0x5ca);
          pLVar4 = google::protobuf::internal::LogMessage::operator<<
                             (&local_210,"CHECK failed: (index) < (current_size_): ");
          google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_2f8,pLVar4);
          google::protobuf::internal::LogMessage::~LogMessage(&local_210);
        }
        iVar2 = *(int *)((long)((pBVar8->borderamounts_).super_RepeatedPtrFieldBase.rep_)->elements
                               [0] + 0x10);
        if ((LVar7.pooling_)->_oneof_case_[0] == 0x1e) {
          pVVar12 = ((PoolingPaddingTypeUnion *)&(LVar7.scale_)->bias_)->valid_;
        }
        else {
          pVVar12 = Specification::ValidPadding::default_instance();
        }
        pBVar8 = pVVar12->paddingamounts_;
        if (pBVar8 == (BorderAmounts *)0x0) {
          pBVar8 = (BorderAmounts *)&Specification::_BorderAmounts_default_instance_;
        }
        if ((pBVar8->borderamounts_).super_RepeatedPtrFieldBase.current_size_ < 1) {
          google::protobuf::internal::LogMessage::LogMessage
                    ((LogMessage *)(local_268 + 0x20),LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                     ,0x5ca);
          pLVar4 = google::protobuf::internal::LogMessage::operator<<
                             ((LogMessage *)(local_268 + 0x20),
                              "CHECK failed: (index) < (current_size_): ");
          google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_2f8,pLVar4);
          google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)(local_268 + 0x20));
        }
        iVar17 = *(int *)((long)((pBVar8->borderamounts_).super_RepeatedPtrFieldBase.rep_)->elements
                                [0] + 0x18);
        if ((LVar7.pooling_)->_oneof_case_[0] == 0x1e) {
          pVVar12 = ((PoolingPaddingTypeUnion *)&(LVar7.scale_)->bias_)->valid_;
        }
        else {
          pVVar12 = Specification::ValidPadding::default_instance();
        }
        pBVar8 = pVVar12->paddingamounts_;
        if (pBVar8 == (BorderAmounts *)0x0) {
          pBVar8 = (BorderAmounts *)&Specification::_BorderAmounts_default_instance_;
        }
        if ((pBVar8->borderamounts_).super_RepeatedPtrFieldBase.current_size_ < 2) {
          google::protobuf::internal::LogMessage::LogMessage
                    (&local_2c0,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                     ,0x5ca);
          pLVar4 = google::protobuf::internal::LogMessage::operator<<
                             (&local_2c0,"CHECK failed: (index) < (current_size_): ");
          google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_2f8,pLVar4);
          google::protobuf::internal::LogMessage::~LogMessage(&local_2c0);
        }
        iVar3 = *(int *)(*(long *)((pBVar8->borderamounts_).super_RepeatedPtrFieldBase.rep_ + 1) +
                        0x10);
        if ((LVar7.pooling_)->_oneof_case_[0] == 0x1e) {
          pVVar12 = ((PoolingPaddingTypeUnion *)&(LVar7.scale_)->bias_)->valid_;
        }
        else {
          pVVar12 = Specification::ValidPadding::default_instance();
        }
        pBVar8 = pVVar12->paddingamounts_;
        if (pBVar8 == (BorderAmounts *)0x0) {
          pBVar8 = (BorderAmounts *)&Specification::_BorderAmounts_default_instance_;
        }
        if ((pBVar8->borderamounts_).super_RepeatedPtrFieldBase.current_size_ < 2) {
          google::protobuf::internal::LogMessage::LogMessage
                    (&local_2f8,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                     ,0x5ca);
          pLVar4 = google::protobuf::internal::LogMessage::operator<<
                             (&local_2f8,"CHECK failed: (index) < (current_size_): ");
          google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_268,pLVar4);
          google::protobuf::internal::LogMessage::~LogMessage(&local_2f8);
        }
        iVar14 = *(int *)(*(long *)((pBVar8->borderamounts_).super_RepeatedPtrFieldBase.rep_ + 1) +
                         0x18);
        iVar17 = iVar17 + iVar2;
      }
      if (0 < iVar16 - iVar17) {
        pSVar5 = ShapeConstraint::heightRange(this_01);
        sVar10 = ShapeRange::minimumValue(pSVar5);
        if (sVar10 == 0) {
          lVar13 = 0;
        }
        else {
          pSVar5 = ShapeConstraint::heightRange(this_01);
          sVar10 = ShapeRange::minimumValue(pSVar5);
          lVar13 = sVar10 - 1;
        }
        ShapeConstraint::lowerBoundHeight(this_00,(ulong)(uint)(iVar16 - iVar17) + iVar18 * lVar13);
      }
      pSVar5 = ShapeConstraint::heightRange(this_00);
      ShapeRange::operator+(&local_1d8,pSVar5,iVar17 - iVar16);
      ShapeRange::operator/((ShapeRange *)local_288,&local_1d8,(long)iVar18);
      ShapeRange::operator+((ShapeRange *)local_268,(ShapeRange *)local_288,1);
      ShapeConstraint::updateHeightRange(this_01,(ShapeRange *)local_268);
      uVar20 = iVar19 - (iVar14 + iVar3);
      if (0 < (int)uVar20) {
        pSVar5 = ShapeConstraint::widthRange(this_01);
        sVar10 = ShapeRange::minimumValue(pSVar5);
        if (sVar10 == 0) {
          lVar13 = 0;
        }
        else {
          pSVar5 = ShapeConstraint::widthRange(this_01);
          sVar10 = ShapeRange::minimumValue(pSVar5);
          lVar13 = sVar10 - 1;
        }
        ShapeConstraint::lowerBoundWidth(this_00,(ulong)uVar20 + iVar15 * lVar13);
      }
      pSVar5 = ShapeConstraint::widthRange(this_00);
      ShapeRange::operator+(&local_1d8,pSVar5,(iVar14 + iVar3) - iVar19);
      pLVar4 = (LogMessage *)local_288;
      ShapeRange::operator/((ShapeRange *)pLVar4,&local_1d8,(long)iVar15);
      __return_storage_ptr__ = (LogMessage *)local_268;
    }
    else {
      if (uVar1 != 0x1f) {
        if (uVar1 != 0x20) {
          return;
        }
        iVar14 = 0;
        iVar3 = 0;
        iVar17 = 0;
        if (((PoolingPaddingTypeUnion *)&(LVar7.scale_)->bias_)->same_->asymmetrymode_ != 0) {
          if ((LVar7.pooling_)->_oneof_case_[0] == 0x20) {
            pPVar9 = ((PoolingPaddingTypeUnion *)&(LVar7.scale_)->bias_)->includelastpixel_;
          }
          else {
            pPVar9 = Specification::PoolingLayerParams_ValidCompletePadding::default_instance();
          }
          if ((pPVar9->paddingamounts_).current_size_ < 1) {
            google::protobuf::internal::LogMessage::LogMessage
                      (&local_2c0,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                       ,0x476);
            pLVar4 = google::protobuf::internal::LogMessage::operator<<
                               (&local_2c0,"CHECK failed: (index) < (current_size_): ");
            google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_2f8,pLVar4);
            google::protobuf::internal::LogMessage::~LogMessage(&local_2c0);
          }
          iVar17 = (int)((pPVar9->paddingamounts_).rep_)->elements[0];
          if ((LVar7.pooling_)->_oneof_case_[0] == 0x20) {
            pPVar9 = ((PoolingPaddingTypeUnion *)&(LVar7.scale_)->bias_)->includelastpixel_;
          }
          else {
            pPVar9 = Specification::PoolingLayerParams_ValidCompletePadding::default_instance();
          }
          if ((pPVar9->paddingamounts_).current_size_ < 2) {
            google::protobuf::internal::LogMessage::LogMessage
                      (&local_2f8,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                       ,0x476);
            pLVar4 = google::protobuf::internal::LogMessage::operator<<
                               (&local_2f8,"CHECK failed: (index) < (current_size_): ");
            google::protobuf::internal::LogFinisher::operator=
                      ((LogFinisher *)(local_268 + 0x20),pLVar4);
            google::protobuf::internal::LogMessage::~LogMessage(&local_2f8);
          }
          iVar3 = *(int *)&(pPVar9->paddingamounts_).rep_[1].arena;
        }
        if (iVar17 != 0 || iVar3 != 0) {
          sVar10 = ShapeConstraint::minimumHeight(this_00);
          sVar11 = ShapeConstraint::minimumHeight(this_00);
          iVar14 = -(uint)((int)sVar11 + iVar17 <=
                          ((iVar18 + iVar17) * 2 - iVar16) + (int)sVar10 + -2);
        }
        pSVar5 = ShapeConstraint::heightRange(this_00);
        ShapeRange::operator+((ShapeRange *)local_288,pSVar5,-(iVar16 + iVar17 * -2));
        ShapeRange::divideAndRoundUp((ShapeRange *)local_268,(ShapeRange *)local_288,(long)iVar18);
        ShapeRange::operator+((ShapeRange *)&local_210,(ShapeRange *)local_268,1);
        ShapeRange::operator+((ShapeRange *)(local_268 + 0x20),(ShapeRange *)&local_210,iVar14);
        ShapeConstraint::updateHeightRange(this_01,(ShapeRange *)(local_268 + 0x20));
        uVar20 = iVar16 + iVar17 * -2;
        if (uVar20 != 0 && SBORROW4(iVar16,iVar17 * 2) == (int)uVar20 < 0) {
          pSVar5 = ShapeConstraint::heightRange(this_01);
          sVar10 = ShapeRange::minimumValue(pSVar5);
          ShapeConstraint::lowerBoundHeight(this_00,(uVar20 + sVar10) - 1);
        }
        if (iVar17 == 0 && iVar3 == 0) {
          iVar16 = 0;
        }
        else {
          sVar10 = ShapeConstraint::minimumWidth(this_00);
          sVar11 = ShapeConstraint::minimumWidth(this_00);
          iVar16 = -(uint)((int)sVar11 + iVar3 <= (int)sVar10 + ((iVar3 + iVar15) * 2 - iVar19) + -2
                          );
        }
        pSVar5 = ShapeConstraint::widthRange(this_00);
        ShapeRange::operator+((ShapeRange *)local_288,pSVar5,-(iVar19 + iVar3 * -2));
        ShapeRange::divideAndRoundUp((ShapeRange *)local_268,(ShapeRange *)local_288,(long)iVar15);
        ShapeRange::operator+((ShapeRange *)&local_210,(ShapeRange *)local_268,1);
        ShapeRange::operator+((ShapeRange *)(local_268 + 0x20),(ShapeRange *)&local_210,iVar16);
        ShapeConstraint::updateWidthRange(this_01,(ShapeRange *)(local_268 + 0x20));
        uVar20 = iVar19 + iVar3 * -2;
        if (uVar20 == 0 || SBORROW4(iVar19,iVar3 * 2) != (int)uVar20 < 0) {
          return;
        }
        pSVar5 = ShapeConstraint::widthRange(this_01);
        sVar10 = ShapeRange::minimumValue(pSVar5);
        ShapeConstraint::lowerBoundHeight(this_00,(uVar20 + sVar10) - 1);
        return;
      }
      pSVar5 = ShapeConstraint::heightRange(this_00);
      ShapeRange::operator-((ShapeRange *)(local_268 + 0x20),pSVar5,1);
      ShapeRange::operator/((ShapeRange *)&local_2c0,(ShapeRange *)(local_268 + 0x20),(long)iVar18);
      ShapeRange::operator+((ShapeRange *)&local_2f8,(ShapeRange *)&local_2c0,1);
      ShapeConstraint::updateHeightRange(this_01,(ShapeRange *)&local_2f8);
      pSVar5 = ShapeConstraint::widthRange(this_00);
      ShapeRange::operator-((ShapeRange *)(local_268 + 0x20),pSVar5,1);
      pLVar4 = &local_2c0;
      ShapeRange::operator/((ShapeRange *)pLVar4,(ShapeRange *)(local_268 + 0x20),(long)iVar15);
      __return_storage_ptr__ = &local_2f8;
    }
    ShapeRange::operator+((ShapeRange *)__return_storage_ptr__,(ShapeRange *)pLVar4,1);
    ShapeConstraint::updateWidthRange(this_01,(ShapeRange *)__return_storage_ptr__);
  }
  return;
}

Assistant:

void NeuralNetworkShaper::shapePoolingLayer(const Specification::NeuralNetworkLayer& specLayer) {

    ShapeConstraint& inputShape = blobShapes[specLayer.input(0)];
    ShapeConstraint& outputShape = blobShapes[specLayer.output(0)];
    outputShape.setName(specLayer.output(0));

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Pooling layer " << specLayer.name() << " input shapes (before): " << std::endl;
    std::cout << inputShape;
    std::cout << "Pooling layer " << specLayer.name() << " output shapes (before): " << std::endl;
    std::cout << outputShape;
#endif

    outputShape.updateSequenceRange(outputShape.sequenceRange().intersect(inputShape.sequenceRange()));
    outputShape.updateBatchRange(outputShape.batchRange().intersect(inputShape.batchRange()));
    outputShape.updateChannelRange(inputShape.channelRange());

    inputShape.updateSequenceRange(outputShape.sequenceRange());
    inputShape.updateBatchRange(outputShape.batchRange());
    inputShape.updateChannelRange(outputShape.channelRange());

    const Specification::PoolingLayerParams& pool = specLayer.pooling();

    int Kh, Kw, hstride, wstride;
    Kh = Kw = 3;
    hstride = wstride = 1;
    if (pool.kernelsize_size() != 0){
        Kh = static_cast<int>(pool.kernelsize(0)); //height
        Kw = static_cast<int>(pool.kernelsize(1)); //width
    }
    if (pool.stride_size() != 0){
        hstride = static_cast<int>(pool.stride(0)); //height
        wstride = static_cast<int>(pool.stride(1)); //width
    }

    int l, r, b, t;
    l = r = b = t = 0;

    if (pool.globalpooling()) {
        outputShape.setHeight(1);
        outputShape.setWidth(1);
    } else {
        switch (pool.PoolingPaddingType_case()) {
            case Specification::PoolingLayerParams::kValid:
                if (pool.valid().paddingamounts().borderamounts_size() != 0){
                    t = static_cast<int>(pool.valid().paddingamounts().borderamounts(0).startedgesize());
                    b = static_cast<int>(pool.valid().paddingamounts().borderamounts(0).endedgesize());
                    l = static_cast<int>(pool.valid().paddingamounts().borderamounts(1).startedgesize());
                    r = static_cast<int>(pool.valid().paddingamounts().borderamounts(1).endedgesize());
                }

                if (Kh - b - t > 0) {
                    size_t inputLowerBound = outputShape.heightRange().minimumValue() == 0 ? 0 : (outputShape.heightRange().minimumValue() - 1);
                    inputShape.lowerBoundHeight(inputLowerBound * static_cast<size_t>(hstride) + static_cast<size_t>(Kh - b - t));
//                    inputShape.lowerBoundHeight(inputLowerBound + static_cast<size_t>(Kh - b - t));
                }

                outputShape.updateHeightRange((inputShape.heightRange() + (t + b - Kh))/static_cast<size_t>(hstride) + 1);

                if (Kw - l - r > 0) {
                    size_t inputLowerBound = outputShape.widthRange().minimumValue() == 0 ? 0 : (outputShape.widthRange().minimumValue() - 1);
                    inputShape.lowerBoundWidth(inputLowerBound * static_cast<size_t>(wstride) + static_cast<size_t>(Kw - l - r));
//                    inputShape.lowerBoundWidth(inputLowerBound + static_cast<size_t>(Kw - l - r));
                }
                outputShape.updateWidthRange((inputShape.widthRange() + (r + l - Kw))/static_cast<size_t>(wstride) + 1);

                break;
            case Specification::PoolingLayerParams::kSame:
                // needs to round up
                outputShape.updateHeightRange((inputShape.heightRange() - 1)/ static_cast<size_t>(hstride) + 1);
                outputShape.updateWidthRange((inputShape.widthRange() - 1) / static_cast<size_t>(wstride) + 1);
                break;
            case Specification::PoolingLayerParams::kIncludeLastPixel: {
                if (pool.includelastpixel().paddingamounts_size() != 0){
                    t = static_cast<int>(pool.includelastpixel().paddingamounts(0));
                    l = static_cast<int>(pool.includelastpixel().paddingamounts(1));
                }
                // subtracting in the numerator and adding 1 in order to get integer division rounded up
                int addExtra = 0;
                if (t || l) {
                    if ((static_cast<int>(inputShape.minimumHeight()) - 1 + (2*t - Kh - 1) + 2 * hstride) >= (static_cast<int>(inputShape.minimumHeight()) + t)) {
                        addExtra = -1;
                    }
                }
                outputShape.updateHeightRange((inputShape.heightRange() + (2*t - Kh)).divideAndRoundUp(static_cast<size_t>(hstride)) + 1 + addExtra);
                if (Kh - 2*t > 0)
                    inputShape.lowerBoundHeight(outputShape.heightRange().minimumValue() - 1 + static_cast<size_t>(Kh - 2*t));

                addExtra = 0;
                if (t || l){
                    if ((static_cast<int>(inputShape.minimumWidth()) - 1 + (2*l - Kw - 1) + 2 * wstride) >= (static_cast<int>(inputShape.minimumWidth()) + l)) {
                        addExtra = -1;
                    }
                }
                outputShape.updateWidthRange((inputShape.widthRange() + (2*l - Kw)).divideAndRoundUp(static_cast<size_t>(wstride)) + 1 + addExtra);
                if (Kw - 2*l > 0)
                    inputShape.lowerBoundHeight(outputShape.widthRange().minimumValue() - 1 + static_cast<size_t>(Kw - 2*l));
                break;
            }
            case Specification::PoolingLayerParams::POOLINGPADDINGTYPE_NOT_SET:
                throw std::runtime_error("Pooling padding type not set");
        }
    }

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Pooling layer " << specLayer.name() << " input shapes (after): " << std::endl;
    std::cout << inputShape;
    std::cout << "Pooling layer " << specLayer.name() << " output shapes (after): " << std::endl;
    std::cout << outputShape;
#endif


}